

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

_argument_lists * __thiscall
gl4cts::GPUShaderFP64Test8::getArgumentListsForVariableType
          (_argument_lists *__return_storage_ptr__,GPUShaderFP64Test8 *this,
          _variable_type *variable_type)

{
  _variable_type type;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  reference pp_Var4;
  _argument_list_tree_node *p_Var5;
  size_type sVar6;
  size_type sVar7;
  reference pp_Var8;
  size_type sVar9;
  __normal_iterator<gl4cts::Utils::_variable_type_*,_std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>_>
  local_1a8;
  const_iterator local_1a0;
  value_type local_198;
  _argument_list_tree_node *current_node_ptr_2;
  _argument_list argument_list;
  uint n_leaf_node;
  uint local_168;
  uint n_leaf_nodes;
  uint n_children_node;
  uint n_children_nodes;
  _argument_list_tree_node *current_node_ptr_1;
  undefined1 local_150 [8];
  _argument_list_tree_nodes leaf_nodes;
  _argument_list_tree_node *new_subnode_1;
  int n_new_argument_components;
  _variable_type new_argument_type_1;
  uint n_scalar_type;
  _argument_list_tree_node *new_subnode;
  uint local_110;
  _variable_type new_argument_type;
  uint n_matrix_type;
  int n_components_remaining;
  _argument_list_tree_node *current_node_ptr;
  undefined1 local_e8 [8];
  _argument_list_tree_node_queue nodes_queue;
  _argument_list_tree_node root;
  int n_total_components;
  uint n_scalar_types;
  uint n_matrix_types;
  _variable_type scalar_types [4];
  _variable_type matrix_types [9];
  _variable_type *variable_type_local;
  GPUShaderFP64Test8 *this_local;
  _argument_lists *result;
  
  scalar_types[2] = VARIABLE_TYPE_DMAT2;
  scalar_types[3] = VARIABLE_TYPE_DMAT2X3;
  _n_scalar_types = 0xe00000004;
  scalar_types[0] = VARIABLE_TYPE_DVEC3;
  scalar_types[1] = VARIABLE_TYPE_DVEC4;
  uVar2 = Utils::getNumberOfComponentsForVariableType(*variable_type);
  _argument_list_tree_node::_argument_list_tree_node
            ((_argument_list_tree_node *)
             &nodes_queue.c.
              super__Deque_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node);
  std::
  queue<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*,std::deque<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*,std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*>>>
  ::
  queue<std::deque<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*,std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*>>,void>
            ((queue<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*,std::deque<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*,std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node*>>>
              *)local_e8);
  current_node_ptr =
       (_argument_list_tree_node *)
       &nodes_queue.c.
        super__Deque_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_node;
  std::
  queue<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::deque<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>_>
  ::push((queue<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::deque<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>_>
          *)local_e8,&current_node_ptr);
  do {
    pp_Var4 = std::
              queue<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::deque<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>_>
              ::front((queue<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::deque<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>_>
                       *)local_e8);
    _n_matrix_type = *pp_Var4;
    std::
    queue<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::deque<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>_>
    ::pop((queue<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::deque<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>_>
           *)local_e8);
    new_argument_type = uVar2 - _n_matrix_type->n_components_used;
    bVar1 = Utils::isMatrixVariableType(_n_matrix_type->type);
    if (bVar1) {
      for (local_110 = 0; local_110 < 9; local_110 = local_110 + 1) {
        new_subnode._4_4_ = scalar_types[(ulong)local_110 + 2];
        p_Var5 = (_argument_list_tree_node *)operator_new(0x30);
        _argument_list_tree_node::_argument_list_tree_node(p_Var5);
        p_Var5->n_components_used = uVar2;
        p_Var5->parent = _n_matrix_type;
        p_Var5->type = new_subnode._4_4_;
        _new_argument_type_1 = p_Var5;
        std::
        vector<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
        ::push_back(&_n_matrix_type->children,(value_type *)&new_argument_type_1);
      }
    }
    bVar1 = Utils::isMatrixVariableType(_n_matrix_type->type);
    if (!bVar1) {
      for (n_new_argument_components = 0; (uint)n_new_argument_components < 4;
          n_new_argument_components = n_new_argument_components + 1) {
        type = (&n_scalar_types)[(uint)n_new_argument_components];
        uVar3 = Utils::getNumberOfComponentsForVariableType(type);
        if ((int)uVar3 <= (int)new_argument_type) {
          p_Var5 = (_argument_list_tree_node *)operator_new(0x30);
          _argument_list_tree_node::_argument_list_tree_node(p_Var5);
          p_Var5->n_components_used = uVar3 + _n_matrix_type->n_components_used;
          p_Var5->parent = _n_matrix_type;
          p_Var5->type = type;
          leaf_nodes.
          super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)p_Var5;
          std::
          vector<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
          ::push_back(&_n_matrix_type->children,
                      (value_type *)
                      &leaf_nodes.
                       super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::
          queue<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::deque<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>_>
          ::push((queue<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::deque<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>_>
                  *)local_e8,
                 (value_type *)
                 &leaf_nodes.
                  super__Vector_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
      }
    }
    sVar6 = std::
            queue<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::deque<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>_>
            ::size((queue<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::deque<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>_>
                    *)local_e8);
  } while (sVar6 != 0);
  std::
  vector<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
  ::vector((vector<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
            *)local_150);
  current_node_ptr_1 =
       (_argument_list_tree_node *)
       &nodes_queue.c.
        super__Deque_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_node;
  std::
  queue<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::deque<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>_>
  ::push((queue<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::deque<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>_>
          *)local_e8,&current_node_ptr_1);
  do {
    pp_Var4 = std::
              queue<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::deque<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>_>
              ::front((queue<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::deque<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>_>
                       *)local_e8);
    _n_children_node = *pp_Var4;
    std::
    queue<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::deque<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>_>
    ::pop((queue<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::deque<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>_>
           *)local_e8);
    sVar7 = std::
            vector<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
            ::size(&_n_children_node->children);
    if (sVar7 == 0) {
      std::
      vector<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
      ::push_back((vector<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
                   *)local_150,(value_type *)&n_children_node);
    }
    else {
      sVar7 = std::
              vector<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
              ::size(&_n_children_node->children);
      for (local_168 = 0; local_168 < (uint)sVar7; local_168 = local_168 + 1) {
        pp_Var8 = std::
                  vector<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
                  ::operator[](&_n_children_node->children,(ulong)local_168);
        std::
        queue<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::deque<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>_>
        ::push((queue<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::deque<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>_>
                *)local_e8,pp_Var8);
      }
    }
    sVar6 = std::
            queue<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::deque<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>_>
            ::size((queue<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::deque<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>_>
                    *)local_e8);
  } while (sVar6 != 0);
  sVar7 = std::
          vector<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
          ::size((vector<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
                  *)local_150);
  std::
  vector<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>,_std::allocator<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>_>_>
  ::vector(__return_storage_ptr__);
  for (argument_list.
       super__Vector_base<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      argument_list.
      super__Vector_base<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < (uint)sVar7;
      argument_list.
      super__Vector_base<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           argument_list.
           super__Vector_base<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>::
    vector((vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_> *)
           &current_node_ptr_2);
    pp_Var8 = std::
              vector<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
              ::operator[]((vector<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
                            *)local_150,
                           (ulong)argument_list.
                                  super__Vector_base<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    local_198 = *pp_Var8;
    do {
      if (local_198 !=
          (value_type)
          &nodes_queue.c.
           super__Deque_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_node) {
        sVar9 = std::
                vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>
                ::size((vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>
                        *)&current_node_ptr_2);
        if (sVar9 == 0) {
          std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>
          ::push_back((vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>
                       *)&current_node_ptr_2,&local_198->type);
        }
        else {
          local_1a8._M_current =
               (_variable_type *)
               std::
               vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>
               ::begin((vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>
                        *)&current_node_ptr_2);
          __gnu_cxx::
          __normal_iterator<gl4cts::Utils::_variable_type_const*,std::vector<gl4cts::Utils::_variable_type,std::allocator<gl4cts::Utils::_variable_type>>>
          ::__normal_iterator<gl4cts::Utils::_variable_type*>
                    ((__normal_iterator<gl4cts::Utils::_variable_type_const*,std::vector<gl4cts::Utils::_variable_type,std::allocator<gl4cts::Utils::_variable_type>>>
                      *)&local_1a0,&local_1a8);
          std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>
          ::insert((vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>
                    *)&current_node_ptr_2,local_1a0,&local_198->type);
        }
      }
      local_198 = local_198->parent;
    } while (local_198 != (_argument_list_tree_node *)0x0);
    std::
    vector<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>,_std::allocator<std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&current_node_ptr_2);
    std::vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_>::
    ~vector((vector<gl4cts::Utils::_variable_type,_std::allocator<gl4cts::Utils::_variable_type>_> *
            )&current_node_ptr_2);
  }
  std::
  vector<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
  ::~vector((vector<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
             *)local_150);
  std::
  queue<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::deque<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>_>
  ::~queue((queue<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::deque<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>_>
            *)local_e8);
  _argument_list_tree_node::~_argument_list_tree_node
            ((_argument_list_tree_node *)
             &nodes_queue.c.
              super__Deque_base<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*,_std::allocator<gl4cts::GPUShaderFP64Test8::_argument_list_tree_node_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node);
  return __return_storage_ptr__;
}

Assistant:

GPUShaderFP64Test8::_argument_lists GPUShaderFP64Test8::getArgumentListsForVariableType(
	const Utils::_variable_type& variable_type)
{
	const Utils::_variable_type matrix_types[] = {
		Utils::VARIABLE_TYPE_DMAT2, Utils::VARIABLE_TYPE_DMAT2X3, Utils::VARIABLE_TYPE_DMAT2X4,
		Utils::VARIABLE_TYPE_DMAT3, Utils::VARIABLE_TYPE_DMAT3X2, Utils::VARIABLE_TYPE_DMAT3X4,
		Utils::VARIABLE_TYPE_DMAT4, Utils::VARIABLE_TYPE_DMAT4X2, Utils::VARIABLE_TYPE_DMAT4X3,
	};
	const Utils::_variable_type scalar_types[] = { Utils::VARIABLE_TYPE_DOUBLE, Utils::VARIABLE_TYPE_DVEC2,
												   Utils::VARIABLE_TYPE_DVEC3, Utils::VARIABLE_TYPE_DVEC4 };
	const unsigned int n_matrix_types	 = sizeof(matrix_types) / sizeof(matrix_types[0]);
	const unsigned int n_scalar_types	 = sizeof(scalar_types) / sizeof(scalar_types[0]);
	const int		   n_total_components = (int)Utils::getNumberOfComponentsForVariableType(variable_type);

	/* Construct the argument list tree root. Each node carries a counter that tells how many components
	 * have already been assigned. Nodes that eat up all components are considered leaves and do not have
	 * any children. Otherwise, each node is assigned as many children, as there are types that could be
	 * used to define a subsequent argument, and its counter is increased by the amount of components
	 * described by the type.
	 */
	_argument_list_tree_node root;

	root.n_components_used = 0;
	root.parent			   = NULL;
	root.type			   = variable_type;

	/* Fill till all leaves use up all available components */
	_argument_list_tree_node_queue nodes_queue;

	nodes_queue.push(&root);

	do
	{
		/* Pop the first item in the queue */
		_argument_list_tree_node* current_node_ptr = nodes_queue.front();
		nodes_queue.pop();

		/* Matrix variable types can be defined by a combination of non-matrix variable types OR
		 * a single matrix variable type.
		 *
		 * Let's handle the latter case first.
		 */
		const int n_components_remaining = n_total_components - current_node_ptr->n_components_used;

		if (Utils::isMatrixVariableType(current_node_ptr->type))
		{
			/* Iterate through all known matrix types. All the types can be used
			 * as a constructor, assuming only one value is used to define new matrix's
			 * contents. */
			for (unsigned int n_matrix_type = 0; n_matrix_type < n_matrix_types; ++n_matrix_type)
			{
				Utils::_variable_type new_argument_type = matrix_types[n_matrix_type];

				/* Construct a new child node. Since GLSL spec clearly states we must not use more
				 * than one constructor argument if the only argument is a matrix type, mark the node
				 * as if it defined all available components.
				 */
				_argument_list_tree_node* new_subnode = new _argument_list_tree_node;

				new_subnode->n_components_used = n_total_components;
				new_subnode->parent			   = current_node_ptr;
				new_subnode->type			   = new_argument_type;

				/* Add the descriptor to node list but do not add it to the queue. This would be
				 * a redundant operation, since no new children nodes would have been assigned to
				 * this node anyway.
				 */
				current_node_ptr->children.push_back(new_subnode);
			} /* for (all matrix types) */
		}	 /* if (current node's type is a matrix) */

		/* Now for a combination of non-matrix variable types.. */
		if (!Utils::isMatrixVariableType(current_node_ptr->type))
		{
			/* Iterate through all known scalar types */
			for (unsigned int n_scalar_type = 0; n_scalar_type < n_scalar_types; ++n_scalar_type)
			{
				Utils::_variable_type new_argument_type = scalar_types[n_scalar_type];
				const int n_new_argument_components = Utils::getNumberOfComponentsForVariableType(new_argument_type);

				/* Only use the scalar type if we don't exceed the amount of components we can define
				 * for requested type.
				 */
				if (n_new_argument_components <= n_components_remaining)
				{
					/* Form new node descriptor */
					_argument_list_tree_node* new_subnode = new _argument_list_tree_node;

					new_subnode->n_components_used = n_new_argument_components + current_node_ptr->n_components_used;
					new_subnode->parent			   = current_node_ptr;
					new_subnode->type			   = new_argument_type;

					current_node_ptr->children.push_back(new_subnode);
					nodes_queue.push(new_subnode);
				}
			} /* for (all scalar types) */
		}	 /* if (!Utils::isMatrixVariableType(current_node_ptr->type) ) */
	} while (nodes_queue.size() > 0);

	/* To construct the argument lists, traverse the tree. Each path from root to child
	 * gives us a single argument list.
	 *
	 * First, identify leaf nodes.
	 */
	_argument_list_tree_nodes leaf_nodes;

	nodes_queue.push(&root);

	do
	{
		_argument_list_tree_node* current_node_ptr = nodes_queue.front();
		nodes_queue.pop();

		if (current_node_ptr->children.size() == 0)
		{
			/* This is a leaf node !*/
			leaf_nodes.push_back(current_node_ptr);
		}
		else
		{
			/* Throw all children nodes to the queue */
			const unsigned int n_children_nodes = (const unsigned int)current_node_ptr->children.size();

			for (unsigned int n_children_node = 0; n_children_node < n_children_nodes; ++n_children_node)
			{
				nodes_queue.push(current_node_ptr->children[n_children_node]);
			} /* for (all children nodes) */
		}
	} while (nodes_queue.size() > 0);

	/* For all leaf nodes, move up the tree and construct the argument lists. */
	const unsigned int n_leaf_nodes = (const unsigned int)leaf_nodes.size();
	_argument_lists	result;

	for (unsigned int n_leaf_node = 0; n_leaf_node < n_leaf_nodes; ++n_leaf_node)
	{
		_argument_list			  argument_list;
		_argument_list_tree_node* current_node_ptr = leaf_nodes[n_leaf_node];

		do
		{
			if (current_node_ptr != &root)
			{
				if (argument_list.size() == 0)
				{
					argument_list.push_back(current_node_ptr->type);
				}
				else
				{
					argument_list.insert(argument_list.begin(), current_node_ptr->type);
				}
			}

			current_node_ptr = current_node_ptr->parent;
		} while (current_node_ptr != NULL);

		result.push_back(argument_list);
	} /* for (all leaf nodes) */

	return result;
}